

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O3

bool EqualsIgnoreCase(string *s1,string *s2,locale *loc)

{
  size_type sVar1;
  pointer pcVar2;
  pointer pcVar3;
  char cVar4;
  char cVar5;
  ctype *pcVar6;
  long lVar7;
  bool bVar8;
  bool bVar9;
  
  pcVar6 = std::use_facet<std::ctype<char>>(loc);
  sVar1 = s1->_M_string_length;
  if (sVar1 == s2->_M_string_length) {
    if (sVar1 == 0) {
      bVar8 = true;
    }
    else {
      pcVar2 = (s1->_M_dataplus)._M_p;
      pcVar3 = (s2->_M_dataplus)._M_p;
      lVar7 = 0;
      do {
        cVar5 = pcVar3[lVar7];
        cVar4 = (**(code **)(*(long *)pcVar6 + 0x20))(pcVar6,(int)pcVar2[lVar7]);
        cVar5 = (**(code **)(*(long *)pcVar6 + 0x20))(pcVar6,(int)cVar5);
        bVar8 = cVar4 == cVar5;
        if (!bVar8) {
          return bVar8;
        }
        bVar9 = sVar1 - 1 != lVar7;
        lVar7 = lVar7 + 1;
      } while (bVar9);
    }
  }
  else {
    bVar8 = false;
  }
  return bVar8;
}

Assistant:

inline bool EqualsIgnoreCase(const std::string& s1, const std::string& s2, const std::locale& loc = std::locale()) {
    const std::ctype<char>& ctype = std::use_facet<std::ctype<char>>(loc);
    const auto compareCharLower = [&](char c1, char c2) { return ctype.tolower(c1) == ctype.tolower(c2); };
    return s1.size() == s2.size() && std::equal(s1.begin(), s1.end(), s2.begin(), compareCharLower);
}